

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkeysequenceedit.cpp
# Opt level: O2

void __thiscall QKeySequenceEdit::keyPressEvent(QKeySequenceEdit *this,QKeyEvent *e)

{
  uint uVar1;
  QKeySequenceEditPrivate *this_00;
  Data *pDVar2;
  QKeyCombination *pQVar3;
  qsizetype qVar4;
  bool bVar5;
  QKeyCombination QVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int i;
  undefined1 *puVar10;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_b0;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<QKeyCombination> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QKeySequenceEditPrivate **)(this + 8);
  QVar6 = QKeyEvent::keyCombination(e);
  local_58.d = (Data *)CONCAT44(local_58.d._4_4_,QVar6.combination);
  bVar5 = QListSpecialMethodsBase<QKeyCombination>::contains<QKeyCombination>
                    ((QListSpecialMethodsBase<QKeyCombination> *)&this_00->finishingKeyCombinations,
                     (QKeyCombination *)&local_58);
  if (bVar5) {
    QKeySequenceEditPrivate::finishEditing(this_00);
    goto LAB_003e0fa1;
  }
  uVar1 = *(uint *)(e + 0x40);
  if (this_00->prevKey == -1) {
    clear(this);
    this_00->prevKey = uVar1;
  }
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_58.size = 0;
  QLineEdit::setPlaceholderText(this_00->lineEdit,(QString *)&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if ((uVar1 + 0xfeffffe0 < 4) || (uVar1 == 0x1ffffff)) goto LAB_003e0fa1;
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QLineEdit::selectedText((QString *)&local_58,this_00->lineEdit);
  if ((undefined1 *)local_58.size == (undefined1 *)0x0) {
LAB_003e104f:
    if (this_00->keyNum < this_00->maximumSequenceLength) {
      uVar7 = QKeyEvent::modifiers();
      if ((uVar7 >> 0x19 & 1) == 0) {
        uVar7 = QKeyEvent::modifiers();
        local_78.d = *(Data **)(e + 0x28);
        local_78.ptr = *(QKeyCombination **)(e + 0x30);
        local_78.size = *(qsizetype *)(e + 0x38);
        if (local_78.d != (Data *)0x0) {
          LOCK();
          ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        uVar7 = uVar7 & 0x1c000000 | uVar1;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
      }
      else {
        local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.ptr = (QKeyCombination *)&DAT_aaaaaaaaaaaaaaaa;
        QKeyMapper::possibleKeys((QKeyEvent *)&local_78);
        iVar8 = (int)local_78.size;
        uVar7 = uVar1;
        if (iVar8 != 0) {
          for (puVar10 = (undefined1 *)0x0; puVar10 < (ulong)local_78.size; puVar10 = puVar10 + 1) {
            uVar7 = local_78.ptr[(long)puVar10].combination;
            iVar9 = QKeyEvent::modifiers();
            if ((uVar7 - uVar1 == iVar9) ||
               ((uVar7 == uVar1 &&
                (iVar9 = QKeyEvent::modifiers(), uVar7 = uVar1, iVar9 == 0x2000000))))
            goto LAB_003e1138;
          }
          uVar7 = (local_78.ptr)->combination;
        }
LAB_003e1138:
        QArrayDataPointer<QKeyCombination>::~QArrayDataPointer(&local_78);
        if (iVar8 == 0) goto LAB_003e1232;
      }
      this_00->key[this_00->keyNum].combination = uVar7;
      this_00->keyNum = this_00->keyNum + 1;
      QKeySequenceEditPrivate::rebuildKeySequence(this_00);
      local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.ptr = (QKeyCombination *)&DAT_aaaaaaaaaaaaaaaa;
      QKeySequence::toString((SequenceFormat)&local_78);
      if (this_00->keyNum < this_00->maximumSequenceLength) {
        tr((QString *)&local_b0,"%1, ...",(char *)0x0,-1);
        QString::arg<QString,_true>
                  ((QString *)&local_98,(QString *)&local_b0,(QString *)&local_78,0,(QChar)0x20);
        qVar4 = local_78.size;
        pQVar3 = local_78.ptr;
        pDVar2 = local_78.d;
        local_78.d = (Data *)local_98.d;
        local_78.ptr = (QKeyCombination *)local_98.ptr;
        local_98.d = (Data *)pDVar2;
        local_98.ptr = (char16_t *)pQVar3;
        local_78.size = local_98.size;
        local_98.size = qVar4;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
      }
      QLineEdit::setText(this_00->lineEdit,(QString *)&local_78);
      e[0xc] = (QKeyEvent)0x1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
    }
  }
  else {
    QLineEdit::text((QString *)&local_78,this_00->lineEdit);
    bVar5 = ::comparesEqual((QString *)&local_58,(QString *)&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
    if ((!bVar5) || (clear(this), uVar1 != 0x1000003)) goto LAB_003e104f;
  }
LAB_003e1232:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
LAB_003e0fa1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QKeySequenceEdit::keyPressEvent(QKeyEvent *e)
{
    Q_D(QKeySequenceEdit);

    if (d->finishingKeyCombinations.contains(e->keyCombination())) {
        d->finishEditing();
        return;
    }

    int nextKey = e->key();

    if (d->prevKey == -1) {
        clear();
        d->prevKey = nextKey;
    }

    d->lineEdit->setPlaceholderText(QString());
    if (nextKey == Qt::Key_Control
            || nextKey == Qt::Key_Shift
            || nextKey == Qt::Key_Meta
            || nextKey == Qt::Key_Alt
            || nextKey == Qt::Key_unknown) {
        return;
    }

    QString selectedText = d->lineEdit->selectedText();
    if (!selectedText.isEmpty() && selectedText == d->lineEdit->text()) {
        clear();
        if (nextKey == Qt::Key_Backspace)
            return;
    }

    if (d->keyNum >= d->maximumSequenceLength)
        return;

    if (e->modifiers() & Qt::ShiftModifier) {
        const QList<QKeyCombination> possibleKeys = QKeyMapper::possibleKeys(e);
        int pkTotal = possibleKeys.size();
        if (!pkTotal)
            return;
        bool found = false;
        for (int i = 0; i < possibleKeys.size(); ++i) {
            const int key = possibleKeys.at(i).toCombined();
            if (key - nextKey == int(e->modifiers())
                || (key == nextKey && e->modifiers() == Qt::ShiftModifier)) {
                nextKey = key;
                found = true;
                break;
            }
        }
        // Use as fallback
        if (!found)
            nextKey = possibleKeys.first().toCombined();
    } else {
        nextKey |= d->translateModifiers(e->modifiers(), e->text());
    }


    d->key[d->keyNum] = QKeyCombination::fromCombined(nextKey);
    d->keyNum++;

    d->rebuildKeySequence();
    QString text = d->keySequence.toString(QKeySequence::NativeText);
    if (d->keyNum < d->maximumSequenceLength) {
        //: This text is an "unfinished" shortcut, expands like "Ctrl+A, ..."
        text = tr("%1, ...").arg(text);
    }
    d->lineEdit->setText(text);
    e->accept();
}